

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_destSize_extState
              (void *state,char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  int iVar1;
  uint uVar2;
  int targetDstSize_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  void *state_local;
  
  LZ4_resetStream((LZ4_stream_t *)state);
  iVar1 = LZ4_compressBound(*srcSizePtr);
  if (targetDstSize < iVar1) {
    if (*srcSizePtr < 0x1000b) {
      state_local._4_4_ =
           LZ4_compress_destSize_generic(state,src,dst,srcSizePtr,targetDstSize,byU16);
    }
    else {
      uVar2 = LZ4_64bits();
      state_local._4_4_ =
           LZ4_compress_destSize_generic(state,src,dst,srcSizePtr,targetDstSize,(uint)(uVar2 != 0));
    }
  }
  else {
    state_local._4_4_ = LZ4_compress_fast_extState(state,src,dst,*srcSizePtr,targetDstSize,1);
  }
  return state_local._4_4_;
}

Assistant:

static int LZ4_compress_destSize_extState (void* state, const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
    LZ4_resetStream((LZ4_stream_t*)state);

    if (targetDstSize >= LZ4_compressBound(*srcSizePtr))   /* compression success is guaranteed */
    {
        return LZ4_compress_fast_extState(state, src, dst, *srcSizePtr, targetDstSize, 1);
    }
    else
    {
        if (*srcSizePtr < LZ4_64Klimit)
            return LZ4_compress_destSize_generic(state, src, dst, srcSizePtr, targetDstSize, byU16);
        else
            return LZ4_compress_destSize_generic(state, src, dst, srcSizePtr, targetDstSize, LZ4_64bits() ? byU32 : byPtr);
    }
}